

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

int SSL_get_tlsext_status_type(SSL *ssl)

{
  SSL_HANDSHAKE *pSVar1;
  SSL_CONFIG *pSVar2;
  byte bVar3;
  
  if ((ssl->field_0xa4 & 1) == 0) {
    pSVar2 = (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
    if (pSVar2 == (SSL_CONFIG *)0x0) {
      return -1;
    }
    bVar3 = pSVar2->field_0x10d & 4;
  }
  else {
    pSVar1 = (ssl->s3->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
    if (pSVar1 == (SSL_HANDSHAKE *)0x0) {
      return -1;
    }
    bVar3 = pSVar1->field_0x6c8 & 0x80;
  }
  return -(uint)(bVar3 == 0) | 1;
}

Assistant:

int SSL_get_tlsext_status_type(const SSL *ssl) {
  if (ssl->server) {
    SSL_HANDSHAKE *hs = ssl->s3->hs.get();
    return hs != nullptr && hs->ocsp_stapling_requested
               ? TLSEXT_STATUSTYPE_ocsp
               : TLSEXT_STATUSTYPE_nothing;
  }

  return ssl->config != nullptr && ssl->config->ocsp_stapling_enabled
             ? TLSEXT_STATUSTYPE_ocsp
             : TLSEXT_STATUSTYPE_nothing;
}